

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcPrintBasicVariableInfo(ExternTypeInfo *type,char *ptr)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  uint uVar5;
  undefined8 uVar6;
  double dVar7;
  
  pcVar3 = nullcDebugSymbols((uint *)0x0);
  if (type->subCat == CAT_POINTER) {
    pvVar4 = NULLC::GetBasePointer(*(void **)ptr);
    if (pvVar4 != (void *)0x0) {
      printf("%p [base %p, ",*(undefined8 *)ptr,pvVar4);
      nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar4 + -8));
      iVar2 = 0x5d;
LAB_0012bc57:
      putchar(iVar2);
      return;
    }
    uVar6 = *(undefined8 *)ptr;
    pcVar3 = "%p";
LAB_0012bcdc:
    printf(pcVar3,uVar6);
    return;
  }
  switch(type->type) {
  case TYPE_INT:
    pcVar3 = "0x%x";
    if ((type->field_11).subType == 0) {
      pcVar3 = "%d";
    }
    uVar5 = *(uint *)ptr;
    break;
  case TYPE_FLOAT:
    dVar7 = (double)*(float *)ptr;
    goto LAB_0012bcf4;
  case TYPE_LONG:
    pcVar3 = "0x%llx";
    if ((type->field_11).subType == 0) {
      pcVar3 = "%lld";
    }
    uVar6 = *(undefined8 *)ptr;
    goto LAB_0012bcdc;
  case TYPE_DOUBLE:
    dVar7 = *(double *)ptr;
LAB_0012bcf4:
    printf("%f",dVar7);
    return;
  case TYPE_SHORT:
    uVar5 = (uint)*(short *)ptr;
    pcVar3 = "%d";
    break;
  case TYPE_CHAR:
    iVar2 = strcmp(pcVar3 + type->offsetToName,"bool");
    bVar1 = *ptr;
    if (iVar2 != 0) {
      if (bVar1 != 0) {
        printf("\'%c\' (%d)",(ulong)bVar1);
        return;
      }
      iVar2 = 0x30;
      goto LAB_0012bc57;
    }
    pcVar3 = "true";
    if (bVar1 == 0) {
      pcVar3 = "false";
    }
    goto LAB_0012bd5d;
  default:
    pcVar3 = "not basic type";
LAB_0012bd5d:
    printf(pcVar3);
    return;
  }
  printf(pcVar3,(ulong)uVar5);
  return;
}

Assistant:

void nullcPrintBasicVariableInfo(const ExternTypeInfo& type, char* ptr)
{
	char *codeSymbols = nullcDebugSymbols(NULL);

	if(type.subCat == ExternTypeInfo::CAT_POINTER)
	{
		if(void *base = NULLC::GetBasePointer(*(void**)ptr))
		{
			markerType *marker = (markerType*)((char*)base - sizeof(markerType));

			printf("%p [base %p, ", *(void**)ptr, base);
			nullcPrintPointerMarkerInfo(*marker);
			printf("]");
		}
		else
		{
			printf("%p", *(void**)ptr);
		}

		return;
	}

	switch(type.type)
	{
	case ExternTypeInfo::TYPE_CHAR:
		if(strcmp(codeSymbols + type.offsetToName, "bool") == 0)
		{
			printf(*(unsigned char*)ptr ? "true" : "false");
		}
		else
		{
			if(*(unsigned char*)ptr)
				printf("'%c' (%d)", *(unsigned char*)ptr, (int)*(unsigned char*)ptr);
			else
				printf("0");
		}
		break;
	case ExternTypeInfo::TYPE_SHORT:
		printf("%d", *(short*)ptr);
		break;
	case ExternTypeInfo::TYPE_INT:
		printf(type.subType == 0 ? "%d" : "0x%x", *(int*)ptr);
		break;
	case ExternTypeInfo::TYPE_LONG:
		printf(type.subType == 0 ? "%lld" : "0x%llx", *(long long*)ptr);
		break;
	case ExternTypeInfo::TYPE_FLOAT:
		printf("%f", *(float*)ptr);
		break;
	case ExternTypeInfo::TYPE_DOUBLE:
		printf("%f", *(double*)ptr);
		break;
	default:
		printf("not basic type");
	}
}